

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyexr.h
# Opt level: O3

bool __thiscall tinyexr::IsAnyOffsetsAreInvalid(tinyexr *this,OffsetData *offset_data)

{
  long lVar1;
  long lVar2;
  ulong uVar3;
  uint uVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  long lVar8;
  ulong uVar9;
  
  uVar3 = 0;
  if ((long)offset_data - (long)this != 0) {
    uVar5 = ((long)offset_data - (long)this >> 3) * -0x5555555555555555;
    do {
      lVar1 = *(long *)(this + uVar3 * 0x18);
      if (*(long *)(this + uVar3 * 0x18 + 8) - lVar1 != 0) {
        uVar6 = (*(long *)(this + uVar3 * 0x18 + 8) - lVar1 >> 3) * -0x5555555555555555;
        uVar7 = 0;
        do {
          lVar2 = *(long *)(lVar1 + uVar7 * 0x18);
          lVar8 = *(long *)(lVar1 + 8 + uVar7 * 0x18) - lVar2;
          if (lVar8 != 0) {
            uVar4 = 1;
            uVar9 = 0;
            do {
              if (*(long *)(lVar2 + uVar9 * 8) < 1) {
                uVar3 = 1;
                goto LAB_001cd34b;
              }
              uVar9 = (ulong)uVar4;
              uVar4 = uVar4 + 1;
            } while (uVar9 < (ulong)(lVar8 >> 3));
          }
          uVar7 = (ulong)((int)uVar7 + 1);
        } while (uVar7 <= uVar6 && uVar6 - uVar7 != 0);
      }
      uVar3 = (ulong)((int)uVar3 + 1);
    } while (uVar3 <= uVar5 && uVar5 - uVar3 != 0);
    uVar3 = 0;
  }
LAB_001cd34b:
  return SUB81(uVar3,0);
}

Assistant:

static bool IsAnyOffsetsAreInvalid(const OffsetData& offset_data) {
  for (unsigned int l = 0; l < offset_data.offsets.size(); ++l)
    for (unsigned int dy = 0; dy < offset_data.offsets[l].size(); ++dy)
      for (unsigned int dx = 0; dx < offset_data.offsets[l][dy].size(); ++dx)
        if (reinterpret_cast<const tinyexr::tinyexr_int64&>(offset_data.offsets[l][dy][dx]) <= 0)
          return true;

  return false;
}